

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

void App::execute(int argc,char **argv)

{
  ostream *poVar1;
  runtime_error *this;
  vector<Config::Size,_std::allocator<Config::Size>_> *pages_00;
  Library library;
  vector<Config::Size,_std::allocator<Config::Size>_> pages;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileNames;
  Font font;
  Glyphs glyphs;
  Config config;
  Library local_190;
  undefined1 local_188 [48];
  undefined1 local_158 [72];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
  local_110;
  Config local_e0;
  
  ProgramOptions::parseCommandLine(&local_e0,argc,argv);
  ft::Library::Library(&local_190);
  if (local_e0.verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"freetype ",9);
    ft::Library::getVersionString_abi_cxx11_((string *)local_158,&local_190);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_158._0_8_,local_158._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_);
    }
  }
  pages_00 = (vector<Config::Size,_std::allocator<Config::Size>_> *)(ulong)local_e0.monochrome;
  ft::Font::Font((Font *)local_158,&local_190,&local_e0.fontFile,(uint)local_e0.fontSize,0,
                 local_e0.monochrome);
  collectGlyphInfo((Glyphs *)&local_110,(Font *)local_158,&local_e0.chars);
  arrangeGlyphs((vector<Config::Size,_std::allocator<Config::Size>_> *)local_188,
                (Glyphs *)&local_110,&local_e0);
  if ((local_e0.useMaxTextureCount == true) &&
     ((ulong)local_e0.maxTextureCount < (ulong)((long)(local_188._8_8_ - local_188._0_8_) >> 3))) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"too many generated textures (more than --max-texture-count)");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  renderTextures_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_188 + 0x18),(App *)&local_110,(Glyphs *)&local_e0,(Config *)local_158,
             (Font *)local_188,pages_00);
  writeFontInfoFile((Glyphs *)&local_110,&local_e0,(Font *)local_158,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_188 + 0x18),
                    (vector<Config::Size,_std::allocator<Config::Size>_> *)local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_188 + 0x18));
  if ((pointer)local_188._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_188._0_8_);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
  ::~_Rb_tree(&local_110);
  FT_Done_Face(local_158._8_8_);
  ft::Library::~Library(&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.output._M_dataplus._M_p != &local_e0.output.field_2) {
    operator_delete(local_e0.output._M_dataplus._M_p);
  }
  if (local_e0.textureSizeList.super__Vector_base<Config::Size,_std::allocator<Config::Size>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.textureSizeList.
                    super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_e0.chars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.fontFile._M_dataplus._M_p != &local_e0.fontFile.field_2) {
    operator_delete(local_e0.fontFile._M_dataplus._M_p);
  }
  return;
}

Assistant:

void App::execute(const int argc, char* argv[])
{
    const auto config = ProgramOptions::parseCommandLine(argc, argv);

    ft::Library library;
    if (config.verbose)
        std::cout << "freetype " << library.getVersionString() << "\n";

    ft::Font font(library, config.fontFile, config.fontSize, 0, config.monochrome);

    auto glyphs = collectGlyphInfo(font, config.chars);
    const auto pages = arrangeGlyphs(glyphs, config);
    if (config.useMaxTextureCount && pages.size() > config.maxTextureCount)
        throw std::runtime_error("too many generated textures (more than --max-texture-count)");

    const auto fileNames = renderTextures(glyphs, config, font, pages);
    writeFontInfoFile(glyphs, config, font, fileNames, pages);
}